

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double beta_sample(double a,double b,int *seed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __x;
  
  dVar1 = a + -1.0;
  __x = a + b + -2.0;
  if (__x < 0.0) {
    dVar2 = sqrt(__x);
  }
  else {
    dVar2 = SQRT(__x);
  }
  do {
    do {
      do {
        dVar3 = normal_01_sample(seed);
        dVar8 = (0.5 / dVar2) * dVar3 + dVar1 / __x;
      } while (dVar8 < 0.0);
    } while (1.0 < dVar8);
    dVar4 = r8_uniform_01(seed);
    dVar5 = log(dVar8 / dVar1);
    dVar6 = log((1.0 - dVar8) / (b + -1.0));
    dVar7 = log(__x);
    dVar4 = log(dVar4);
  } while (dVar3 * 0.5 * dVar3 + dVar7 * __x + dVar5 * dVar1 + dVar6 * (b + -1.0) < dVar4);
  return dVar8;
}

Assistant:

double beta_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_SAMPLE samples the Beta PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    William Kennedy, James Gentle,
//    Algorithm BN,
//    Statistical Computing,
//    Dekker, 1980.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double BETA_SAMPLE, a sample of the PDF.
//
{
  double mu;
  double stdev;
  double test;
  double u;
  double x;
  double y;

  mu = ( a - 1.0 ) / ( a + b - 2.0 );
  stdev = 0.5 / sqrt ( a + b - 2.0 );

  for ( ; ; )
  {
    y = normal_01_sample ( seed );

    x = mu + stdev * y;

    if ( x < 0.0 || 1.0 < x )
    {
      continue;
    }

    u = r8_uniform_01 ( seed );

    test =     ( a - 1.0 )     * log (         x   / ( a - 1.0 ) )
             + ( b - 1.0 )     * log ( ( 1.0 - x ) / ( b - 1.0 ) )
             + ( a + b - 2.0 ) * log ( a + b - 2.0 ) + 0.5 * y * y;

    if ( log ( u ) <= test )
    {
      break;
    }

  }

  return x;
}